

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O3

size_t absl::lts_20240722::cord_internal::GetMorePreciseMemoryUsage(Nonnull<const_CordRep_*> rep)

{
  size_t sVar1;
  byte bVar2;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<const_absl::lts_20240722::cord_internal::CordRep_*,_true,_false>,_bool>
  pVar3;
  __node_gen_type __node_gen;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2> raw_usage;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2> local_50;
  
  local_50.total = 0;
  local_50.counted._M_h._M_buckets = &local_50.counted._M_h._M_single_bucket;
  local_50.counted._M_h._M_bucket_count = 1;
  local_50.counted._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50.counted._M_h._M_element_count = 0;
  local_50.counted._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_50.counted._M_h._M_rehash_policy._M_next_resize = 0;
  local_50.counted._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar2 = rep->tag;
  if (bVar2 == 2) {
    pVar3 = std::
            _Hashtable<absl::lts_20240722::cord_internal::CordRep_const*,absl::lts_20240722::cord_internal::CordRep_const*,std::allocator<absl::lts_20240722::cord_internal::CordRep_const*>,std::__detail::_Identity,std::equal_to<absl::lts_20240722::cord_internal::CordRep_const*>,std::hash<absl::lts_20240722::cord_internal::CordRep_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<absl::lts_20240722::cord_internal::CordRep_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<absl::lts_20240722::cord_internal::CordRep_const*,false>>>>
                      ((_Hashtable<absl::lts_20240722::cord_internal::CordRep_const*,absl::lts_20240722::cord_internal::CordRep_const*,std::allocator<absl::lts_20240722::cord_internal::CordRep_const*>,std::__detail::_Identity,std::equal_to<absl::lts_20240722::cord_internal::CordRep_const*>,std::hash<absl::lts_20240722::cord_internal::CordRep_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_50.counted);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_50.total = local_50.total + 0x20;
    }
    if (rep->tag != '\x02') {
      __assert_fail("IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x5f,"const CordRepCrc *absl::cord_internal::CordRep::crc() const");
    }
    rep = (Nonnull<const_CordRep_*>)rep[1].length;
    if (rep == (Nonnull<const_CordRep_*>)0x0) goto LAB_0011405a;
    bVar2 = rep->tag;
  }
  if (bVar2 < 5) {
    if (bVar2 == 3) {
      anon_unknown_0::
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>
                ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>)rep,
                 &local_50);
      goto LAB_0011405a;
    }
    if ((bVar2 != 1) || (*(byte *)(*(long *)&rep[1].refcount + 0xc) < 5)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotalMorePrecise]"
                   );
    }
  }
  anon_unknown_0::AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>
            ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>)rep,
             &local_50);
LAB_0011405a:
  sVar1 = local_50.total;
  std::
  _Hashtable<const_absl::lts_20240722::cord_internal::CordRep_*,_const_absl::lts_20240722::cord_internal::CordRep_*,_std::allocator<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::__detail::_Identity,_std::equal_to<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::hash<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_50.counted._M_h);
  return sVar1;
}

Assistant:

size_t GetMorePreciseMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kTotalMorePrecise>(rep);
}